

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

uint8_t __thiscall wasm::WasmBinaryReader::getLaneIndex(WasmBinaryReader *this,size_t lanes)

{
  byte bVar1;
  string local_40;
  
  bVar1 = getInt8(this);
  if (bVar1 < lanes) {
    return bVar1;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Illegal lane index","");
  throwError(this,&local_40);
}

Assistant:

uint8_t WasmBinaryReader::getLaneIndex(size_t lanes) {
  auto ret = getInt8();
  if (ret >= lanes) {
    throwError("Illegal lane index");
  }
  return ret;
}